

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode set_login(connectdata *conn)

{
  char *pcVar1;
  char *local_30;
  char *setpasswd;
  char *setuser;
  CURLcode result;
  connectdata *conn_local;
  
  setuser._4_4_ = CURLE_OK;
  setpasswd = "anonymous";
  local_30 = "ftp@example.com";
  if (((conn->handler->flags & 0x20) == 0) || ((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) != 0)) {
    setpasswd = "";
    local_30 = "";
  }
  if (conn->user == (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(setpasswd);
    conn->user = pcVar1;
    if (conn->user == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (conn->passwd == (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(local_30);
    conn->passwd = pcVar1;
    if (conn->passwd == (char *)0x0) {
      setuser._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return setuser._4_4_;
}

Assistant:

static CURLcode set_login(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  const char *setuser = CURL_DEFAULT_USER;
  const char *setpasswd = CURL_DEFAULT_PASSWORD;

  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) && !conn->bits.user_passwd)
    ;
  else {
    setuser = "";
    setpasswd = "";
  }
  /* Store the default user */
  if(!conn->user) {
    conn->user = strdup(setuser);
    if(!conn->user)
      return CURLE_OUT_OF_MEMORY;
  }

  /* Store the default password */
  if(!conn->passwd) {
    conn->passwd = strdup(setpasswd);
    if(!conn->passwd)
      result = CURLE_OUT_OF_MEMORY;
  }

  return result;
}